

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModel.cpp
# Opt level: O1

void __thiscall HighsModel::userCostScale(HighsModel *this,HighsInt user_cost_scale)

{
  pointer pdVar1;
  long lVar2;
  long lVar3;
  int __exponent;
  double dVar4;
  
  __exponent = user_cost_scale - (this->lp_).user_cost_scale_;
  if (__exponent == 0) {
    return;
  }
  dVar4 = ldexp(1.0,__exponent);
  lVar2 = (long)(this->hessian_).dim_;
  if ((lVar2 != 0) &&
     (lVar2 = (long)(this->hessian_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar2], 0 < lVar2)) {
    pdVar1 = (this->hessian_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = 0;
    do {
      pdVar1[lVar3] = pdVar1[lVar3] * dVar4;
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  HighsLp::userCostScale(&this->lp_,user_cost_scale);
  return;
}

Assistant:

void HighsModel::userCostScale(const HighsInt user_cost_scale) {
  const HighsInt dl_user_cost_scale =
      user_cost_scale - this->lp_.user_cost_scale_;
  if (!dl_user_cost_scale) return;
  double dl_user_cost_scale_value = std::pow(2, dl_user_cost_scale);
  if (this->hessian_.dim_) {
    for (HighsInt iEl = 0; iEl < this->hessian_.start_[this->hessian_.dim_];
         iEl++)
      this->hessian_.value_[iEl] *= dl_user_cost_scale_value;
  }
  this->lp_.userCostScale(user_cost_scale);
}